

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O2

void __thiscall
icu_63::TransliteratorRegistry::registerEntry
          (TransliteratorRegistry *this,UnicodeString *ID,UnicodeString *source,
          UnicodeString *target,UnicodeString *variant,TransliteratorEntry *adopted,UBool visible)

{
  UVector *this_00;
  UBool UVar1;
  uint in_EAX;
  int iVar2;
  undefined4 extraout_var;
  UErrorCode status;
  undefined8 uStack_38;
  UnicodeString *this_01;
  
  uStack_38 = (ulong)in_EAX;
  Hashtable::put(&this->registry,ID,adopted,(UErrorCode *)((long)&uStack_38 + 4));
  this_00 = &this->availableIDs;
  if (visible == '\0') {
    removeSTV(this,source,target,variant);
    UVector::removeElement(this_00,ID);
  }
  else {
    registerSTV(this,source,target,variant);
    UVar1 = UVector::contains(this_00,ID);
    if (UVar1 == '\0') {
      iVar2 = (*(ID->super_Replaceable).super_UObject._vptr_UObject[7])(ID);
      this_01 = (UnicodeString *)CONCAT44(extraout_var,iVar2);
      if (this_01 != (UnicodeString *)0x0) {
        icu_63::UnicodeString::getTerminatedBuffer(this_01);
        UVector::addElement(this_00,this_01,(UErrorCode *)((long)&uStack_38 + 4));
      }
    }
  }
  return;
}

Assistant:

void TransliteratorRegistry::registerEntry(const UnicodeString& ID,
                                           const UnicodeString& source,
                                           const UnicodeString& target,
                                           const UnicodeString& variant,
                                           TransliteratorEntry* adopted,
                                           UBool visible) {
    UErrorCode status = U_ZERO_ERROR;
    registry.put(ID, adopted, status);
    if (visible) {
        registerSTV(source, target, variant);
        if (!availableIDs.contains((void*) &ID)) {
            UnicodeString *newID = (UnicodeString *)ID.clone();
            // Check to make sure newID was created.
            if (newID != NULL) {
                // NUL-terminate the ID string
                newID->getTerminatedBuffer();
                availableIDs.addElement(newID, status);
            }
        }
    } else {
        removeSTV(source, target, variant);
        availableIDs.removeElement((void*) &ID);
    }
}